

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanFlowScalar(Scanner *this,bool IsDoubleQuoted)

{
  uint AtColumn;
  iterator pcVar1;
  char *pcVar2;
  bool bVar3;
  char *Position;
  iterator pcVar4;
  iterator pcVar5;
  undefined7 in_register_00000031;
  iterator Position_00;
  Child local_68;
  iterator local_60;
  long local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pcVar1 = this->Current;
  AtColumn = this->Column;
  if ((int)CONCAT71(in_register_00000031,IsDoubleQuoted) == 0) {
    skip(this,1);
LAB_001ab575:
    Position_00 = this->Current;
    if (Position_00 + 1 < this->End) {
      if (*Position_00 == '\'') {
        if (Position_00[1] != '\'') goto LAB_001ab4ef;
        skip(this,2);
        goto LAB_001ab575;
      }
    }
    else if (*Position_00 == '\'') goto LAB_001ab4ef;
    pcVar4 = skip_nb_char(this,Position_00);
    Position_00 = this->Current;
    if (pcVar4 == Position_00) {
      pcVar5 = skip_b_break(this,Position_00);
      Position_00 = pcVar4;
      if (pcVar5 == pcVar4) goto LAB_001ab4ef;
      this->Current = pcVar5;
      this->Column = 0;
      this->Line = this->Line + 1;
    }
    else {
      if (pcVar4 == this->End) goto LAB_001ab4ef;
      this->Current = pcVar4;
      this->Column = this->Column + 1;
    }
    goto LAB_001ab575;
  }
  do {
    Position = this->Current;
    do {
      pcVar2 = Position;
      Position = pcVar2 + 1;
      this->Current = Position;
      Position_00 = this->End;
      if (Position == this->End) goto LAB_001ab4ef;
    } while (*Position != '\"');
    Position_00 = Position;
    if (*pcVar2 != '\\') goto LAB_001ab4ef;
    bVar3 = wasEscaped(pcVar1 + 1,Position);
  } while (bVar3);
  Position_00 = this->Current;
LAB_001ab4ef:
  pcVar4 = this->End;
  if (Position_00 == pcVar4) {
    Twine::Twine((Twine *)&local_68,"Expected quote at end of scalar");
    setError(this,(Twine *)&local_68,this->Current);
  }
  else {
    skip(this,1);
    local_50 = &local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_68.decUI = 0x12;
    local_58 = (long)this->Current - (long)pcVar1;
    local_60 = pcVar1;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)&local_68);
    saveSimpleKeyCandidate
              (this,(iterator)
                    (this->TokenQueue).List.Sentinel.
                    super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
                    .super_node_base_type.Prev,AtColumn,false);
    this->IsSimpleKeyAllowed = false;
    std::__cxx11::string::_M_dispose();
  }
  return Position_00 != pcVar4;
}

Assistant:

bool Scanner::scanFlowScalar(bool IsDoubleQuoted) {
  StringRef::iterator Start = Current;
  unsigned ColStart = Column;
  if (IsDoubleQuoted) {
    do {
      ++Current;
      while (Current != End && *Current != '"')
        ++Current;
      // Repeat until the previous character was not a '\' or was an escaped
      // backslash.
    } while (   Current != End
             && *(Current - 1) == '\\'
             && wasEscaped(Start + 1, Current));
  } else {
    skip(1);
    while (true) {
      // Skip a ' followed by another '.
      if (Current + 1 < End && *Current == '\'' && *(Current + 1) == '\'') {
        skip(2);
        continue;
      } else if (*Current == '\'')
        break;
      StringRef::iterator i = skip_nb_char(Current);
      if (i == Current) {
        i = skip_b_break(Current);
        if (i == Current)
          break;
        Current = i;
        Column = 0;
        ++Line;
      } else {
        if (i == End)
          break;
        Current = i;
        ++Column;
      }
    }
  }

  if (Current == End) {
    setError("Expected quote at end of scalar", Current);
    return false;
  }

  skip(1); // Skip ending quote.
  Token T;
  T.Kind = Token::TK_Scalar;
  T.Range = StringRef(Start, Current - Start);
  TokenQueue.push_back(T);

  saveSimpleKeyCandidate(--TokenQueue.end(), ColStart, false);

  IsSimpleKeyAllowed = false;

  return true;
}